

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueExampleHugepages.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  atomic<unsigned_long> aVar1;
  ostream *poVar2;
  __atomic_base<unsigned_long> _Var3;
  AllocationResult AVar4;
  thread t;
  SPSCQueue<int,_Allocator<int>_> q;
  long local_1d0;
  long *local_1c8;
  SPSCQueue<int,_Allocator<int>_> local_1c0;
  
  local_1c0.writeIdx_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_1c0.readIdxCache_ = 0;
  local_1c0.readIdx_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_1c0.writeIdxCache_ = 0;
  local_1c0.capacity_ = 3;
  AVar4 = Allocator<int>::allocate_at_least((Allocator<int> *)&local_1c0,0x23);
  local_1c0.slots_ = AVar4.ptr;
  local_1c0.capacity_ = AVar4.count - 0x20;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_1d0 = 0;
  local_1c8 = (long *)operator_new(0x10);
  *local_1c8 = (long)&PTR___State_00103d70;
  local_1c8[1] = (long)&local_1c0;
  std::thread::_M_start_thread(&local_1d0,&local_1c8,0);
  if (local_1c8 != (long *)0x0) {
    (**(code **)(*local_1c8 + 8))();
  }
  aVar1.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_1c0.readIdxCache_;
  _Var3._M_i = 0;
  if ((long)local_1c0.writeIdx_.super___atomic_base<unsigned_long>._M_i + 1U != local_1c0.capacity_)
  {
    _Var3._M_i = (long)local_1c0.writeIdx_.super___atomic_base<unsigned_long>._M_i + 1U;
  }
  do {
    local_1c0.readIdxCache_ = (size_t)aVar1.super___atomic_base<unsigned_long>._M_i;
    aVar1.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_1c0.readIdx_;
  } while (_Var3._M_i == local_1c0.readIdxCache_);
  local_1c0.slots_[(long)local_1c0.writeIdx_.super___atomic_base<unsigned_long>._M_i + 0x10] = 1;
  local_1c0.writeIdx_.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
  std::thread::join();
  if (local_1d0 == 0) {
    rigtorp::SPSCQueue<int,_Allocator<int>_>::~SPSCQueue(&local_1c0);
    return 0;
  }
  std::terminate();
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  SPSCQueue<int, Allocator<int>> q(2);
  std::cout << q.capacity() << std::endl;
  auto t = std::thread([&] {
    while (!q.front())
      ;
    std::cout << *q.front() << std::endl;
    q.pop();
  });
  q.push(1);
  t.join();

  return 0;
}